

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::ConstantMultiFieldModifier::apply
          (ConstantMultiFieldModifier *this,NumberStringBuilder *output,int leftIndex,int rightIndex
          ,UErrorCode *status)

{
  NumberStringBuilder *this_00;
  int __fdin;
  uint uVar1;
  int32_t iVar2;
  ssize_t sVar3;
  UnicodeString local_70;
  int32_t local_2c;
  UErrorCode *pUStack_28;
  int32_t length;
  UErrorCode *status_local;
  int rightIndex_local;
  int leftIndex_local;
  NumberStringBuilder *output_local;
  ConstantMultiFieldModifier *this_local;
  
  pUStack_28 = status;
  status_local._0_4_ = rightIndex;
  status_local._4_4_ = leftIndex;
  _rightIndex_local = output;
  output_local = (NumberStringBuilder *)this;
  local_2c = NumberStringBuilder::insert(output,leftIndex,&this->fPrefix,status);
  this_00 = _rightIndex_local;
  if ((this->fOverwrite & 1U) != 0) {
    __fdin = status_local._4_4_ + local_2c;
    uVar1 = (int)status_local + local_2c;
    icu_63::UnicodeString::UnicodeString(&local_70);
    sVar3 = NumberStringBuilder::splice
                      (this_00,__fdin,(__off64_t *)(ulong)uVar1,(int)&local_70,(__off64_t *)0x0,0,
                       0xb);
    local_2c = (int)sVar3 + local_2c;
    icu_63::UnicodeString::~UnicodeString(&local_70);
  }
  iVar2 = NumberStringBuilder::insert
                    (_rightIndex_local,(int)status_local + local_2c,&this->fSuffix,pUStack_28);
  return iVar2 + local_2c;
}

Assistant:

int32_t ConstantMultiFieldModifier::apply(NumberStringBuilder &output, int leftIndex, int rightIndex,
                                          UErrorCode &status) const {
    int32_t length = output.insert(leftIndex, fPrefix, status);
    if (fOverwrite) {
        length += output.splice(
            leftIndex + length,
            rightIndex + length,
            UnicodeString(), 0, 0,
            UNUM_FIELD_COUNT, status);
    }
    length += output.insert(rightIndex + length, fSuffix, status);
    return length;
}